

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall options::parse(options *this,int argc,char **argv)

{
  vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *this_00;
  char **ppcVar1;
  char cVar2;
  pointer pCVar3;
  pointer pPVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int c;
  Compression CVar9;
  char *pcVar10;
  ostream *poVar11;
  int iVar12;
  _List_node_base *p_Var13;
  double dVar14;
  Compression compression;
  char **local_88;
  vector<PixelMode,_std::allocator<PixelMode>_> *local_80;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string i;
  
  this->timing = 7;
  if (argc == 1) {
    usageMessage((ostream *)&std::cerr,"exrmetrics",true);
  }
  else {
    iVar12 = 1;
    iVar6 = argc + -2;
    local_80 = &this->pixelModes;
    this_00 = &this->compressions;
LAB_001071d6:
    do {
      while( true ) {
        if (argc <= iVar12) {
          if ((this->inFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (this->inFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            std::operator<<((ostream *)&std::cerr,"Missing input file\n");
            usageMessage((ostream *)&std::cerr,"exrmetrics",false);
            return 1;
          }
          if (((this->outputSizeData != false) || (this->timing != 0)) ||
             (this->outFile != (char *)0x0)) {
            if ((this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl
                .super__Vector_impl_data._M_start) {
              i._M_dataplus._M_p._0_4_ = 0;
              std::vector<PixelMode,_std::allocator<PixelMode>_>::emplace_back<PixelMode>
                        (local_80,(PixelMode *)&i);
            }
            if ((this->compressions).
                super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (this->compressions).
                super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              return 0;
            }
            i._M_dataplus._M_p._0_4_ = 10;
            std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
            emplace_back<Imf_3_4::Compression>(this_00,(Compression *)&i);
            return 0;
          }
          std::operator<<((ostream *)&std::cerr,
                          "Nothing to do: no output file specified, and all performance/size data disabled"
                         );
          pcVar10 = "Use -o to specify output image filename\n";
          poVar11 = (ostream *)&std::cerr;
          goto LAB_00107c1e;
        }
        pcVar10 = argv[iVar12];
        cVar2 = *pcVar10;
        if ((((cVar2 == '-') && (pcVar10[1] == 'h')) && (pcVar10[2] == '\0')) ||
           (iVar7 = strcmp(pcVar10,"--help"), iVar7 == 0)) {
          usageMessage((ostream *)&std::cout,"exrmetrics",true);
          return 0;
        }
        iVar7 = strcmp(pcVar10,"--version");
        if (iVar7 == 0) {
          pcVar10 = (char *)Imf_3_4::getLibraryVersion();
          poVar11 = std::operator<<((ostream *)&std::cout,"exrmetrics (OpenEXR) ");
          std::operator<<(poVar11,"3.4.0");
          iVar12 = strcmp(pcVar10,"3.4.0");
          if (iVar12 != 0) {
            poVar11 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar11 = std::operator<<(poVar11,pcVar10);
            std::operator<<(poVar11,")");
          }
          poVar11 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::endl<char,std::char_traits<char>>(poVar11);
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "Copyright (c) Contributors to the OpenEXR Project");
          std::endl<char,std::char_traits<char>>(poVar11);
          poVar11 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::endl<char,std::char_traits<char>>(poVar11);
          return 0;
        }
        ppcVar1 = argv + iVar12;
        if (cVar2 != '-') break;
        if ((pcVar10[1] != 'm') || (pcVar10[2] != '\0')) {
          if ((pcVar10[1] != 't') || (pcVar10[2] != '\0')) break;
          if (iVar6 < iVar12) {
            poVar11 = (ostream *)&std::cerr;
            pcVar10 = "Missing thread count value with -t option\n";
            goto LAB_00107c1e;
          }
          iVar7 = atoi(ppcVar1[1]);
          this->threads = iVar7;
          if (iVar7 < 0) {
            poVar11 = std::operator<<((ostream *)&std::cerr,"bad thread count ");
            poVar11 = std::operator<<(poVar11,ppcVar1[1]);
            pcVar10 = " specified to -t option\n";
            goto LAB_00107c1e;
          }
          goto LAB_001074f1;
        }
        this->threads = -1;
LAB_001075f3:
        iVar12 = iVar12 + 1;
      }
      local_88 = ppcVar1;
      iVar7 = strcmp(pcVar10,"--bench");
      if (iVar7 == 0) {
        pCVar3 = (this->compressions).
                 super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->compressions).
            super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
            super__Vector_impl_data._M_finish != pCVar3) {
          (this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish = pCVar3;
        }
        for (iVar7 = 0; iVar7 != 10; iVar7 = iVar7 + 1) {
          i._M_dataplus._M_p._0_4_ = iVar7;
          std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
          emplace_back<Imf_3_4::Compression>(this_00,(Compression *)&i);
        }
        this->passes = 10;
        this->timing = 6;
        this->outputSizeData = false;
        this->csv = true;
        this->part = -1;
        std::vector<PixelMode,_std::allocator<PixelMode>_>::resize(local_80,2);
        pPVar4 = (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar4[0] = PIXELMODE_ALL_HALF;
        pPVar4[1] = PIXELMODE_ALL_FLOAT;
        goto LAB_001075f3;
      }
      iVar7 = strcmp(pcVar10,"--convert");
      if (iVar7 == 0) {
        std::vector<PixelMode,_std::allocator<PixelMode>_>::resize(local_80,1);
        *(this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
         super__Vector_impl_data._M_start = PIXELMODE_ORIGINAL;
        this->passes = 1;
        this->timing = 0;
        this->outputSizeData = false;
        this->part = -1;
        goto LAB_001075f3;
      }
      iVar7 = strcmp(pcVar10,"--passes");
      ppcVar1 = local_88;
      if (iVar7 == 0) {
        if (iVar6 < iVar12) {
          poVar11 = (ostream *)&std::cerr;
          pcVar10 = "Missing pass count value with --passes option\n";
          goto LAB_00107c1e;
        }
        iVar7 = atoi(local_88[1]);
        this->passes = iVar7;
        if (iVar7 < 0) {
          poVar11 = std::operator<<((ostream *)&std::cerr,"bad value for passes ");
          poVar11 = std::operator<<(poVar11,ppcVar1[1]);
          pcVar10 = " specified to --passes option\n";
          goto LAB_00107c1e;
        }
        goto LAB_001074f1;
      }
      if (((cVar2 == '-') && (pcVar10[1] == 'v')) && (pcVar10[2] == '\0')) {
        this->verbose = true;
        goto LAB_001075f3;
      }
      iVar7 = strcmp(pcVar10,"--csv");
      if (iVar7 == 0) {
        this->csv = true;
        goto LAB_001075f3;
      }
      iVar7 = strcmp(pcVar10,"--json");
      if (iVar7 == 0) {
        this->csv = false;
        goto LAB_001075f3;
      }
      if ((((cVar2 != '-') || (pcVar10[1] != 'z')) || (pcVar10[2] != '\0')) &&
         (iVar7 = strcmp(pcVar10,"--compression"), iVar7 != 0)) {
        if (cVar2 == '-') {
          if ((pcVar10[1] == 'p') && (pcVar10[2] == '\0')) {
            if (iVar6 < iVar12) {
              poVar11 = (ostream *)&std::cerr;
              pcVar10 = "Missing part number with -p option\n";
              goto LAB_00107c1e;
            }
            pcVar10 = local_88[1];
            iVar7 = strcmp(pcVar10,"all");
            if (iVar7 == 0) {
              this->part = -1;
            }
            else {
              iVar7 = atoi(pcVar10);
              this->part = iVar7;
              if (iVar7 < -1) {
                poVar11 = std::operator<<((ostream *)&std::cerr,"bad part ");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->part);
                pcVar10 = " specified to -p option\n";
                goto LAB_00107c1e;
              }
            }
            iVar12 = iVar12 + 2;
            goto LAB_001071d6;
          }
          if ((pcVar10[1] == 'l') && (pcVar10[2] == '\0')) {
            if (iVar6 < iVar12) {
              poVar11 = (ostream *)&std::cerr;
              pcVar10 = "Missing compression level number with -l option\n";
              goto LAB_00107c1e;
            }
            dVar14 = atof(local_88[1]);
            this->level = (float)dVar14;
            if ((float)dVar14 < 0.0) {
              poVar11 = std::operator<<((ostream *)&std::cerr,"bad level ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->level);
              pcVar10 = " specified to -l option\n";
              goto LAB_00107c1e;
            }
          }
          else {
            if ((pcVar10[1] != 'o') || (pcVar10[2] != '\0')) goto LAB_00107373;
            if (iVar6 < iVar12) {
              poVar11 = (ostream *)&std::cerr;
              pcVar10 = "Missing filename specified with -o\n";
              goto LAB_00107c1e;
            }
            if (this->outFile != (char *)0x0) {
              poVar11 = (ostream *)&std::cerr;
              pcVar10 = "-o output filename can only be specified once\n";
              goto LAB_00107c1e;
            }
            this->outFile = local_88[1];
          }
        }
        else {
LAB_00107373:
          iVar7 = strcmp(pcVar10,"-16");
          if (iVar7 == 0) {
            if (iVar6 < iVar12) {
              poVar11 = (ostream *)&std::cerr;
              pcVar10 = "Missing mode with -16 option\n";
LAB_00107c1e:
              std::operator<<(poVar11,pcVar10);
              return 1;
            }
            pcVar10 = local_88[1];
            iVar7 = strcmp(pcVar10,"all");
            if (iVar7 == 0) {
              i._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              iVar7 = strcmp(pcVar10,"rgba");
              if (iVar7 != 0) {
                poVar11 = (ostream *)&std::cerr;
                pcVar10 = " bad mode for -16 option: must be \'all\' or \'rgba\'\n";
                goto LAB_00107c1e;
              }
              i._M_dataplus._M_p._0_4_ = 3;
            }
            std::vector<PixelMode,_std::allocator<PixelMode>_>::emplace_back<PixelMode>
                      (local_80,(PixelMode *)&i);
          }
          else {
            iVar7 = strcmp(pcVar10,"--pixelmode");
            if (iVar7 == 0) {
              if (iVar6 < iVar12) {
                poVar11 = (ostream *)&std::cerr;
                pcVar10 = "Missing type list with  with --pixelmode option\n";
                goto LAB_00107c1e;
              }
              split_abi_cxx11_(&items,local_88[1],',');
              pPVar4 = (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pPVar4) {
                (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl
                .super__Vector_impl_data._M_finish = pPVar4;
              }
              p_Var13 = (_List_node_base *)&items;
              while (p_Var13 = p_Var13->_M_next, p_Var13 != (_List_node_base *)&items) {
                std::__cxx11::string::string((string *)&i,(string *)(p_Var13 + 1));
                bVar5 = std::operator==(&i,"half");
                if (bVar5) {
                  compression = RLE_COMPRESSION;
                  std::vector<PixelMode,_std::allocator<PixelMode>_>::emplace_back<PixelMode>
                            (local_80,&compression);
                }
                else {
                  bVar5 = std::operator==(&i,"float");
                  if (bVar5) {
                    compression = ZIPS_COMPRESSION;
                    std::vector<PixelMode,_std::allocator<PixelMode>_>::emplace_back<PixelMode>
                              (local_80,&compression);
                  }
                  else {
                    bVar5 = std::operator==(&i,"rgba");
                    if ((bVar5) || (bVar5 = std::operator==(&i,"mixed"), bVar5)) {
                      compression = ZIP_COMPRESSION;
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::emplace_back<PixelMode>
                                (local_80,&compression);
                    }
                    else {
                      bVar5 = std::operator==(&i,"orig");
                      if (!bVar5) {
                        poVar11 = std::operator<<((ostream *)&std::cerr,"bad pixel type ");
                        poVar11 = std::operator<<(poVar11,(string *)&i);
                        std::operator<<(poVar11,
                                        " for --pixelmode: must be half,float,rgba,mixed or orig\n")
                        ;
                        goto LAB_00107797;
                      }
                      compression = NO_COMPRESSION;
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::emplace_back<PixelMode>
                                (local_80,&compression);
                    }
                  }
                }
                std::__cxx11::string::~string((string *)&i);
              }
              goto LAB_0010779f;
            }
            iVar7 = strcmp(pcVar10,"--time");
            if (iVar7 != 0) {
              iVar7 = strcmp(pcVar10,"--no-size");
              if (iVar7 == 0) {
                this->outputSizeData = false;
              }
              else {
                if (((cVar2 == '-') && (pcVar10[1] == 'i')) && (pcVar10[2] == '\0')) {
                  if (iVar6 < iVar12) {
                    poVar11 = (ostream *)&std::cerr;
                    pcVar10 = "Missing filename with -i option\n";
                    goto LAB_00107c1e;
                  }
                  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                            (&this->inFiles,local_88 + 1);
                  goto LAB_001074f1;
                }
                std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                          (&this->inFiles,local_88);
              }
              goto LAB_001075f3;
            }
            if (iVar6 < iVar12) {
              poVar11 = (ostream *)&std::cerr;
              pcVar10 = "Missing value list with --time option\n";
              goto LAB_00107c1e;
            }
            this->timing = 0;
            pcVar10 = local_88[1];
            iVar7 = strcmp(pcVar10,"none");
            if (iVar7 != 0) {
              p_Var13 = (_List_node_base *)&items;
              split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)p_Var13,pcVar10,',');
              while (p_Var13 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base.
                               _M_next, p_Var13 != (_List_node_base *)&items) {
                std::__cxx11::string::string((string *)&i,(string *)(p_Var13 + 1));
                bVar5 = std::operator==(&i,"read");
                uVar8 = 1;
                if (!bVar5) {
                  bVar5 = std::operator==(&i,"reread");
                  uVar8 = 4;
                  if (!bVar5) {
                    bVar5 = std::operator==(&i,"write");
                    uVar8 = 2;
                    if (!bVar5) {
                      std::operator<<((ostream *)&std::cerr,
                                      "bad value in timing list. Options are read,write,reread\n");
                      std::__cxx11::string::~string((string *)&i);
                      std::__cxx11::
                      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::_M_clear(&items.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                );
                      return 1;
                    }
                  }
                }
                this->timing = this->timing | uVar8;
                std::__cxx11::string::~string((string *)&i);
              }
              std::__cxx11::
              _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_clear(&items.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        );
            }
          }
        }
LAB_001074f1:
        iVar12 = iVar12 + 2;
        goto LAB_001071d6;
      }
      pCVar3 = (this->compressions).
               super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar3) {
        (this->compressions).
        super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar3;
      }
      if (iVar6 < iVar12) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"Missing compression value with ");
        poVar11 = std::operator<<(poVar11,*local_88);
        pcVar10 = " option\n";
        goto LAB_00107c1e;
      }
      p_Var13 = (_List_node_base *)&items;
      split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)p_Var13,local_88[1],',');
      while (p_Var13 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var13 != (_List_node_base *)&items) {
        std::__cxx11::string::string((string *)&i,(string *)(p_Var13 + 1));
        bVar5 = std::operator==(&i,"orig");
        if (!bVar5) {
          bVar5 = std::operator==(&i,"all");
          if (bVar5) {
            for (CVar9 = NO_COMPRESSION; CVar9 != NUM_COMPRESSION_METHODS;
                CVar9 = CVar9 + RLE_COMPRESSION) {
              compression = CVar9;
              std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
              emplace_back<Imf_3_4::Compression>(this_00,&compression);
            }
            goto LAB_001075dc;
          }
          Imf_3_4::getCompressionIdFromName((string *)&i,&compression);
          if (compression != NUM_COMPRESSION_METHODS) {
            std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::push_back
                      (this_00,&compression);
            goto LAB_001075dc;
          }
          poVar11 = std::operator<<((ostream *)&std::cerr,"unknown compression type ");
          poVar11 = std::operator<<(poVar11,(string *)&i);
          std::endl<char,std::char_traits<char>>(poVar11);
LAB_00107797:
          std::__cxx11::string::~string((string *)&i);
          break;
        }
        compression = NUM_COMPRESSION_METHODS;
        std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
        emplace_back<Imf_3_4::Compression>(this_00,&compression);
LAB_001075dc:
        std::__cxx11::string::~string((string *)&i);
      }
LAB_0010779f:
      iVar12 = iVar12 + 2;
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&items);
    } while (p_Var13 == (_List_node_base *)&items);
  }
  return 1;
}

Assistant:

int
options::parse (int argc, char* argv[])
{

    int i = 1;

    timing = TIME_READ | TIME_WRITE | TIME_REREAD;

    if (argc == 1)
    {
        usageMessage (cerr, "exrmetrics", true);
        return 1;
    }

    while (i < argc)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrmetrics", true);
            return 0;
        }

        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrmetrics (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            threads = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "-t"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing thread count value with -t option\n";
                return 1;
            }

            threads = atoi (argv[i + 1]);
            if (threads < 0)
            {
                cerr << "bad thread count " << argv[i + 1]
                     << " specified to -t option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "--bench"))
        {
            compressions.clear ();
            for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
            {
                compressions.push_back (Compression (c));
            }
            passes         = 10;
            outputSizeData = false;
            csv            = true;
            part           = -1;
            timing         = TIME_WRITE | TIME_REREAD;
            pixelModes.resize (2);
            pixelModes[0] = PIXELMODE_ALL_HALF;
            pixelModes[1] = PIXELMODE_ALL_FLOAT;
            i += 1;
        }
        else if (!strcmp (argv[i], "--convert"))
        {
            pixelModes.resize (1);
            pixelModes[0]  = PIXELMODE_ORIGINAL;
            passes         = 1;
            outputSizeData = false;
            timing         = 0;
            part           = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "--passes"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing pass count value with --passes option\n";
                return 1;
            }
            passes = atoi (argv[i + 1]);
            if (passes < 0)
            {
                cerr << "bad value for passes " << argv[i + 1]
                     << " specified to --passes option\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-v"))
        {
            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--csv"))
        {
            csv = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--json"))
        {
            csv = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-z") || !strcmp (argv[i], "--compression"))
        {
            compressions.clear ();
            if (i > argc - 2)
            {
                cerr << "Missing compression value with " << argv[i]
                     << " option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');

            for (string i: items)
            {

                if (i == "orig")
                {
                    compressions.push_back (NUM_COMPRESSION_METHODS);
                }
                else if (i == "all")
                {
                    for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
                    {
                        compressions.push_back (Compression (c));
                    }
                }
                else
                {
                    Compression compression;
                    getCompressionIdFromName (i, compression);
                    if (compression == Compression::NUM_COMPRESSION_METHODS)
                    {
                        cerr << "unknown compression type " << i << endl;
                        return 1;
                    }
                    compressions.push_back (compression);
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-p"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing part number with -p option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all")) { part = -1; }
            else
            {
                part = atoi (argv[i + 1]);
                if (part < -1)
                {
                    cerr << "bad part " << part << " specified to -p option\n";
                    return 1;
                }
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-l"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing compression level number with -l option\n";
                return 1;
            }
            level = atof (argv[i + 1]);
            if (level < 0)
            {
                cerr << "bad level " << level << " specified to -l option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-o"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename specified with -o\n";
                return 1;
            }
            if (outFile)
            {
                cerr << "-o output filename can only be specified once\n";
                return 1;
            }
            outFile = argv[i + 1];
            i += 2;
        }
        // deprecated flag for backwards compatibility
        else if (!strcmp (argv[i], "-16"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing mode with -16 option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all"))
            {
                pixelModes.push_back (PIXELMODE_ALL_HALF);
            }
            else if (!strcmp (argv[i + 1], "rgba"))
            {
                pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
            }
            else
            {
                cerr << " bad mode for -16 option: must be 'all' or 'rgba'\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--pixelmode"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing type list with  with --pixelmode option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');
            pixelModes.clear ();
            for (string i: items)
            {
                if (i == "half") { pixelModes.push_back (PIXELMODE_ALL_HALF); }
                else if (i == "float")
                {
                    pixelModes.push_back (PIXELMODE_ALL_FLOAT);
                }
                else if (i == "rgba" || i == "mixed")
                {
                    pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
                }
                else if (i == "orig")
                {
                    pixelModes.push_back (PIXELMODE_ORIGINAL);
                }
                else
                {
                    cerr
                        << "bad pixel type " << i
                        << " for --pixelmode: must be half,float,rgba,mixed or orig\n";
                    return 1;
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--time"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing value list with --time option\n";
                return 1;
            }

            timing = TIME_NONE;
            if (strcmp (argv[i + 1], "none"))
            {
                std::list<string> items = split (argv[i + 1], ',');
                for (string i: items)
                {
                    if (i == "read") { timing |= TIME_READ; }
                    else if (i == "reread") { timing |= TIME_REREAD; }
                    else if (i == "write") { timing |= TIME_WRITE; }
                    else
                    {
                        cerr
                            << "bad value in timing list. Options are read,write,reread\n";
                        return 1;
                    }
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--no-size"))
        {
            outputSizeData = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-i"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename with -i option\n";
                return 1;
            }
            inFiles.push_back (argv[i + 1]);
            i += 2;
        }
        else
        {
            inFiles.push_back (argv[i]);
            i += 1;
        }
    }
    if (inFiles.size () == 0)
    {
        cerr << "Missing input file\n";
        usageMessage (cerr, "exrmetrics", false);
        return 1;
    }

    if (!outputSizeData && !timing && !outFile)
    {
        cerr
            << "Nothing to do: no output file specified, and all performance/size data disabled";
        cerr << "Use -o to specify output image filename\n";
        return 1;
    }

    // default options if none specified
    if (pixelModes.size () == 0) { pixelModes.push_back (PIXELMODE_ORIGINAL); }

    if (compressions.size () == 0)
    {
        compressions.push_back (NUM_COMPRESSION_METHODS);
    }

    return 0;
}